

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O3

void __thiscall Tree::quickSort(Tree *this,int L,int R)

{
  short sVar1;
  Node **ppNVar2;
  Node *pNVar3;
  long lVar4;
  int iVar5;
  int R_00;
  int iVar6;
  long lVar7;
  Node *temp;
  long lVar8;
  
  do {
    R_00 = R;
    iVar6 = L;
    if (L <= R) {
      sVar1 = (this->m_queueIndexArray[(L + R) / 2]->field_1).data.year;
      do {
        ppNVar2 = this->m_queueIndexArray;
        lVar7 = (long)iVar6 + -1;
        iVar5 = iVar6;
        do {
          iVar6 = iVar5;
          pNVar3 = ppNVar2[lVar7 + 1];
          lVar7 = lVar7 + 1;
          iVar5 = iVar6 + 1;
        } while ((pNVar3->field_1).data.year < sVar1);
        lVar8 = (long)R_00 + 1;
        iVar5 = R_00;
        do {
          R_00 = iVar5;
          lVar4 = lVar8 + -1;
          lVar8 = lVar8 + -1;
          iVar5 = R_00 + -1;
        } while (sVar1 < (ppNVar2[lVar4]->field_1).data.year);
        if (lVar7 <= lVar8) {
          ppNVar2[lVar7] = ppNVar2[lVar4];
          ppNVar2[lVar8] = pNVar3;
          R_00 = R_00 + -1;
          iVar6 = iVar6 + 1;
        }
      } while (iVar6 <= R_00);
    }
    if (L < R_00) {
      quickSort(this,L,R_00);
    }
    L = iVar6;
  } while (iVar6 < R);
  return;
}

Assistant:

void quickSort(int L, int R) {
        int i = L;
        int j = R;
        Node temp = *m_queueIndexArray[(i + j) / 2];
        while (i <= j) {
            while ((*m_queueIndexArray[i]).data.year < temp.data.year) {
                i++;
            }
            while ((*m_queueIndexArray[j]).data.year > temp.data.year) {
                j--;
            }
            if (i <= j) {
                swapNodes(&m_queueIndexArray[i], &m_queueIndexArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            quickSort(L, j);
        }
        if (i < R) {
            quickSort(i, R);
        }
    }